

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microui.c
# Opt level: O2

int mu_next_command(mu_Context *ctx,mu_Command **cmd)

{
  int iVar1;
  mu_Command *pmVar2;
  
  pmVar2 = *cmd;
  if (pmVar2 == (mu_Command *)0x0) {
    pmVar2 = (mu_Command *)(ctx->command_list).items;
  }
  else {
    pmVar2 = (mu_Command *)((long)(pmVar2->base).size + (long)pmVar2);
  }
  iVar1 = (ctx->command_list).idx;
  while( true ) {
    *cmd = pmVar2;
    if (pmVar2 == (mu_Command *)((ctx->command_list).items + iVar1)) {
      return 0;
    }
    if (pmVar2->type != 1) break;
    pmVar2 = (mu_Command *)(pmVar2->jump).dst;
  }
  return 1;
}

Assistant:

int mu_next_command(mu_Context *ctx, mu_Command **cmd) {
  if (*cmd) {
    *cmd = (mu_Command*) (((char*) *cmd) + (*cmd)->base.size);
  } else {
    *cmd = (mu_Command*) ctx->command_list.items;
  }
  while ((char*) *cmd != ctx->command_list.items + ctx->command_list.idx) {
    if ((*cmd)->type != MU_COMMAND_JUMP) { return 1; }
    *cmd = (*cmd)->jump.dst;
  }
  return 0;
}